

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O0

Abc_Obj_t * Dec_SopToAig(Abc_Ntk_t *pNtk,char *pSop,Vec_Ptr_t *vFaninAigs)

{
  Dec_Graph_t *pGraph;
  Dec_Node_t *pDVar1;
  void *pvVar2;
  Abc_Obj_t *pAVar3;
  int local_3c;
  int i;
  Dec_Node_t *pNode;
  Dec_Graph_t *pFForm;
  Abc_Obj_t *pFunc;
  Vec_Ptr_t *vFaninAigs_local;
  char *pSop_local;
  Abc_Ntk_t *pNtk_local;
  
  pGraph = Dec_Factor(pSop);
  for (local_3c = 0; local_3c < pGraph->nLeaves; local_3c = local_3c + 1) {
    pDVar1 = Dec_GraphNode(pGraph,local_3c);
    pvVar2 = Vec_PtrEntry(vFaninAigs,local_3c);
    (pDVar1->field_2).pFunc = pvVar2;
  }
  pAVar3 = Dec_GraphToNetwork(pNtk,pGraph);
  Dec_GraphFree(pGraph);
  return pAVar3;
}

Assistant:

Abc_Obj_t * Dec_SopToAig( Abc_Ntk_t * pNtk, char * pSop, Vec_Ptr_t * vFaninAigs )
{
    Abc_Obj_t * pFunc;
    Dec_Graph_t * pFForm;
    Dec_Node_t * pNode;
    int i;
    pFForm = Dec_Factor( pSop );
    Dec_GraphForEachLeaf( pFForm, pNode, i )
        pNode->pFunc = Vec_PtrEntry( vFaninAigs, i );
    pFunc = Dec_GraphToNetwork( pNtk, pFForm );
    Dec_GraphFree( pFForm );
    return pFunc;
}